

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

int stbi_write_tga(char *filename,int x,int y,int comp,void *data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  void *__s1;
  ulong uVar6;
  void *pvVar7;
  uchar *d;
  long lVar8;
  size_t __n;
  uint uVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  stbi__write_context s;
  
  s.buffer[0x30] = '\0';
  s.buffer[0x31] = '\0';
  s.buffer[0x32] = '\0';
  s.buffer[0x33] = '\0';
  s.buffer[0x34] = '\0';
  s.buffer[0x35] = '\0';
  s.buffer[0x36] = '\0';
  s.buffer[0x37] = '\0';
  s.buffer[0x38] = '\0';
  s.buffer[0x39] = '\0';
  s.buffer[0x3a] = '\0';
  s.buffer[0x3b] = '\0';
  s.buffer[0x3c] = '\0';
  s.buffer[0x3d] = '\0';
  s.buffer[0x3e] = '\0';
  s.buffer[0x3f] = '\0';
  s.buffer[0x20] = '\0';
  s.buffer[0x21] = '\0';
  s.buffer[0x22] = '\0';
  s.buffer[0x23] = '\0';
  s.buffer[0x24] = '\0';
  s.buffer[0x25] = '\0';
  s.buffer[0x26] = '\0';
  s.buffer[0x27] = '\0';
  s.buffer[0x28] = '\0';
  s.buffer[0x29] = '\0';
  s.buffer[0x2a] = '\0';
  s.buffer[0x2b] = '\0';
  s.buffer[0x2c] = '\0';
  s.buffer[0x2d] = '\0';
  s.buffer[0x2e] = '\0';
  s.buffer[0x2f] = '\0';
  s.buffer[0x10] = '\0';
  s.buffer[0x11] = '\0';
  s.buffer[0x12] = '\0';
  s.buffer[0x13] = '\0';
  s.buffer[0x14] = '\0';
  s.buffer[0x15] = '\0';
  s.buffer[0x16] = '\0';
  s.buffer[0x17] = '\0';
  s.buffer[0x18] = '\0';
  s.buffer[0x19] = '\0';
  s.buffer[0x1a] = '\0';
  s.buffer[0x1b] = '\0';
  s.buffer[0x1c] = '\0';
  s.buffer[0x1d] = '\0';
  s.buffer[0x1e] = '\0';
  s.buffer[0x1f] = '\0';
  s.buffer[0] = '\0';
  s.buffer[1] = '\0';
  s.buffer[2] = '\0';
  s.buffer[3] = '\0';
  s.buffer[4] = '\0';
  s.buffer[5] = '\0';
  s.buffer[6] = '\0';
  s.buffer[7] = '\0';
  s.buffer[8] = '\0';
  s.buffer[9] = '\0';
  s.buffer[10] = '\0';
  s.buffer[0xb] = '\0';
  s.buffer[0xc] = '\0';
  s.buffer[0xd] = '\0';
  s.buffer[0xe] = '\0';
  s.buffer[0xf] = '\0';
  s.func = (stbi_write_func *)0x0;
  s.context = (void *)0x0;
  s.buf_used = 0;
  s._84_4_ = 0;
  iVar1 = stbi__start_write_file(&s,filename);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    bVar12 = (comp - 2U & 0xfffffffd) == 0;
    if ((y | x) < 0) {
      iVar1 = 0;
    }
    else {
      d = (uchar *)0x0;
      stbiw__writef(&s,filename,0,0,(ulong)((int)(comp - (uint)bVar12) < 2 | 10),0,0,0,0,0,x,y,
                    comp * 8,(uint)bVar12 * 8);
      iVar2 = comp * x;
      __n = (size_t)comp;
      lVar5 = (long)y;
      iVar1 = (y + -1) * iVar2;
      while (bVar11 = lVar5 != 0, lVar5 = lVar5 + -1, bVar11) {
        iVar3 = iVar2 * (int)lVar5;
        for (iVar10 = 0; iVar10 < x; iVar10 = uVar9 + iVar10) {
          uVar9 = 1;
          if (iVar10 < x + -1) {
            __s1 = (void *)((long)data + (long)(iVar10 * comp) + (long)iVar3);
            iVar4 = bcmp(__s1,(void *)((long)data + (long)((iVar10 + 1) * comp) + (long)iVar3),__n);
            lVar8 = (long)(iVar10 + 2);
            if (iVar4 != 0) {
              pvVar7 = (void *)((long)data + __n * lVar8 + (long)iVar1);
              uVar9 = 2;
              while( true ) {
                if ((x <= lVar8) || (0x7f < uVar9)) goto LAB_00115e7c;
                iVar4 = bcmp(__s1,pvVar7,__n);
                if (iVar4 == 0) break;
                __s1 = (void *)((long)__s1 + __n);
                uVar9 = uVar9 + 1;
                lVar8 = lVar8 + 1;
                pvVar7 = (void *)((long)pvVar7 + __n);
              }
              uVar9 = uVar9 - 1;
              goto LAB_00115e7c;
            }
            pvVar7 = (void *)((long)data + __n * lVar8 + (long)iVar1);
            uVar9 = 2;
            while (((lVar8 < x && (uVar9 < 0x80)) && (iVar4 = bcmp(__s1,pvVar7,__n), iVar4 == 0))) {
              uVar9 = uVar9 + 1;
              lVar8 = lVar8 + 1;
              pvVar7 = (void *)((long)pvVar7 + __n);
            }
            stbiw__write1(&s,(char)uVar9 + '\x7f');
            stbiw__write_pixel(&s,comp,(uint)bVar12,0,(int)__s1,d);
          }
          else {
LAB_00115e7c:
            stbiw__write1(&s,(char)uVar9 + 0xff);
            uVar6 = (ulong)uVar9;
            lVar8 = (long)data + (long)(iVar10 * comp) + (long)iVar1;
            while (bVar11 = uVar6 != 0, uVar6 = uVar6 - 1, bVar11) {
              stbiw__write_pixel(&s,comp,(uint)bVar12,0,(int)lVar8,d);
              lVar8 = lVar8 + __n;
            }
          }
        }
        iVar1 = iVar1 - iVar2;
      }
      stbiw__write_flush(&s);
      iVar1 = 1;
    }
    fclose((FILE *)s.context);
  }
  return iVar1;
}

Assistant:

STBIWDEF int stbi_write_tga(char const *filename, int x, int y, int comp, const void *data)
{
   stbi__write_context s = { 0 };
   if (stbi__start_write_file(&s,filename)) {
      int r = stbi_write_tga_core(&s, x, y, comp, (void *) data);
      stbi__end_write_file(&s);
      return r;
   } else
      return 0;
}